

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenuPrivate::updateActionRects(QMenuPrivate *this,QRect *screen)

{
  QList<QRect> *this_00;
  QHash<QAction_*,_QWidget_*> *this_01;
  short sVar1;
  short sVar2;
  uint uVar3;
  long lVar4;
  QIcon QVar5;
  char cVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  undefined1 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  QStyle *pQVar22;
  QStyle *pQVar23;
  QWidget *this_02;
  QSize QVar24;
  QSize QVar25;
  undefined8 uVar26;
  QSize QVar27;
  qsizetype n;
  pointer pQVar28;
  QWidget *pQVar29;
  uint uVar30;
  ushort uVar31;
  int extraout_EDX;
  Representation RVar32;
  int iVar33;
  long lVar34;
  SequenceFormat SVar35;
  QRect *this_03;
  Representation RVar36;
  int i;
  ulong uVar37;
  long in_FS_OFFSET;
  int local_1dc;
  long local_1d0;
  QKeySequence seq;
  QIcon is_1;
  undefined1 *local_158;
  QIcon is;
  undefined1 *local_138;
  undefined8 local_130;
  QAction *action_1;
  QFontMetrics qfm;
  QAction *action;
  char16_t *pcStack_110;
  long local_108;
  QRect local_f8 [8];
  QStyleOption opt;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x420 & 1) != 0) {
    pQVar29 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    QWidget::ensurePolished(pQVar29);
    this_00 = &this->actionRects;
    QList<QRect>::resize(this_00,(this->super_QWidgetPrivate).actions.d.size);
    action = (QAction *)0x0;
    pcStack_110 = (char16_t *)0xffffffffffffffff;
    QList<QRect>::fill(this_00,(parameter_type)&action,-1);
    iVar12 = getLastVisibleAction(this);
    pQVar22 = QWidget::style(pQVar29);
    opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    iVar33 = 0;
    QStyleOption::QStyleOption(&opt,1,0);
    QStyleOption::initFrom(&opt,pQVar29);
    iVar13 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x1c,&opt,pQVar29);
    iVar14 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x1d,&opt,pQVar29);
    iVar15 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x3e,&opt,pQVar29);
    iVar16 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x1e,&opt,pQVar29);
    iVar17 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x20,&opt,pQVar29);
    iVar18 = 0;
    if ((this->field_0x421 & 2) != 0) {
      iVar18 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x1f,&opt,pQVar29);
    }
    sVar1 = (this->super_QWidgetPrivate).topmargin;
    if (this->scroll != (QMenuScroller *)0x0) {
      iVar33 = this->scroll->scrollOffset;
    }
    sVar2 = (this->super_QWidgetPrivate).bottommargin;
    iVar20 = (screen->y1).m_i;
    iVar21 = (screen->y2).m_i;
    this->maxIconWidth = 0;
    this->tabWidth = 0;
    this->field_0x420 = this->field_0x420 & 0xfd;
    this->ncols = '\x01';
    this_01 = &this->widgetItems;
    for (uVar37 = 0; uVar37 < (ulong)(this->super_QWidgetPrivate).actions.d.size;
        uVar37 = uVar37 + 1) {
      action = (this->super_QWidgetPrivate).actions.d.ptr[uVar37];
      cVar6 = QAction::isSeparator();
      if (((cVar6 == '\0') && (cVar6 = QAction::isVisible(), cVar6 != '\0')) &&
         (bVar7 = QHash<QAction_*,_QWidget_*>::contains(this_01,&action), !bVar7)) {
        cVar6 = QAction::isCheckable();
        uVar31 = *(ushort *)&this->field_0x420 & 2;
        if (cVar6 != '\0') {
          uVar31 = 2;
        }
        *(ushort *)&this->field_0x420 = *(ushort *)&this->field_0x420 & 0xfffd | uVar31;
        is.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QAction::icon();
        cVar6 = QIcon::isNull();
        if (cVar6 == '\0') {
          uVar30 = this->maxIconWidth;
          if (this->maxIconWidth <= iVar15 + 4U) {
            uVar30 = iVar15 + 4U;
          }
          this->maxIconWidth = uVar30;
        }
        QIcon::~QIcon(&is);
      }
    }
    iVar33 = iVar18 + iVar14 + iVar16 + (int)sVar1 + iVar33;
    iVar17 = ((1 - (iVar14 + iVar16 + iVar17 * 2)) + iVar21) - (sVar2 + iVar20);
    _qfm = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics((QWidget *)&qfm);
    bVar7 = isContextMenu(this);
    pQVar23 = QWidget::style(pQVar29);
    iVar18 = (**(code **)(*(long *)pQVar23 + 0xf0))(pQVar23,0x61,0,pQVar29);
    bVar10 = 1;
    local_1d0 = 0xc;
    local_1dc = 0;
    iVar14 = iVar33;
    for (lVar34 = 0; lVar34 <= iVar12; lVar34 = lVar34 + 1) {
      action_1 = (this->super_QWidgetPrivate).actions.d.ptr[lVar34];
      cVar6 = QAction::isSeparator();
      bVar8 = 1;
      if (cVar6 == '\0') {
LAB_0041f6a1:
        bVar9 = QAction::isSeparator();
        bVar9 = bVar9 & bVar8;
      }
      else {
        QAction::text();
        if (local_108 == 0) {
          QAction::icon();
          bVar8 = QIcon::isNull();
          QIcon::~QIcon(&is);
        }
        else {
          bVar8 = 0;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&action);
        bVar9 = 1;
        if ((iVar18 == 0 & (bVar8 ^ 1)) == 0) goto LAB_0041f6a1;
      }
      cVar6 = QAction::isVisible();
      if (cVar6 != '\0') {
        if (((this->field_0x420 & 8) == 0) || ((bVar10 & bVar9) == 0)) {
          memset((QStyleOptionMenuItem *)&action,0xaa,0x98);
          QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)&action);
          (**(code **)(*(long *)pQVar29 + 0x1a0))(pQVar29,(QStyleOptionMenuItem *)&action,action_1);
          local_130 = 0xffffffffffffffff;
          this_02 = QHash<QAction_*,_QWidget_*>::value(this_01,&action_1);
          if (this_02 == (QWidget *)0x0) {
            cVar6 = QAction::isSeparator();
            if (cVar6 == '\0') {
LAB_0041f815:
              local_138 = &DAT_aaaaaaaaaaaaaaaa;
              is.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
              QAction::text();
              n = QString::indexOf((QString *)&is,(QChar)0x9,0,CaseSensitive);
              if (n == -1) {
                bVar10 = QAction::isShortcutVisibleInContextMenu();
                if ((bVar10 | !bVar7) == 1) {
                  _seq = &DAT_aaaaaaaaaaaaaaaa;
                  QAction::shortcut();
                  cVar6 = QKeySequence::isEmpty();
                  if (cVar6 == '\0') {
                    uVar3 = this->tabWidth;
                    SVar35 = (SequenceFormat)(QArrayDataPointer<char16_t> *)&is_1;
                    QKeySequence::toString(SVar35);
                    uVar19 = QFontMetrics::horizontalAdvance((QString *)&qfm,SVar35);
                    if ((int)uVar19 < (int)uVar3) {
                      uVar19 = uVar3;
                    }
                    this->tabWidth = uVar19;
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&is_1);
                  }
                  QKeySequence::~QKeySequence(&seq);
                }
              }
              else {
                uVar3 = this->tabWidth;
                QString::mid((longlong)&is_1,(longlong)&is);
                uVar19 = QFontMetrics::horizontalAdvance
                                   ((QString *)&qfm,(int)(QArrayDataPointer<char16_t> *)&is_1);
                if ((int)uVar19 < (int)uVar3) {
                  uVar19 = uVar3;
                }
                this->tabWidth = uVar19;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&is_1);
                QString::left((QString *)&is_1,(QString *)&is,n);
                QVar5 = is;
                is = is_1;
                is_1 = QVar5;
                local_138 = local_158;
                local_158 = &DAT_aaaaaaaaaaaaaaaa;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&is_1);
              }
              is_1.d = (QIconPrivate *)0x0;
              iVar20 = QFontMetrics::boundingRect
                                 (local_f8,(int)&is_1,(QString *)0x900,(int)&is,(int *)0x0);
              local_130 = CONCAT44(local_130._4_4_,(extraout_EDX - iVar20) + 1);
              iVar21 = QFontMetrics::height();
              iVar20 = QFontMetrics::height();
              if (iVar20 < iVar21) {
                iVar20 = iVar21;
              }
              is_1.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
              local_130._4_4_ = iVar20;
              QAction::icon();
              cVar6 = QIcon::isNull();
              if ((cVar6 == '\0') && (local_130._4_4_ < iVar15)) {
                local_130._4_4_ = iVar15;
              }
              QIcon::~QIcon(&is_1);
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&is);
            }
            else {
              QAction::text();
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&is);
              if (local_138 != (undefined1 *)0x0) goto LAB_0041f815;
              local_130._0_4_ = 2;
              local_130._4_4_ = 2;
            }
            local_130 = (**(code **)(*(long *)pQVar22 + 0xe8))(pQVar22,7,&action,&local_130);
          }
          else {
            QVar24 = (QSize)(**(code **)(*(long *)this_02 + 0x70))(this_02);
            QVar25 = QWidget::minimumSize(this_02);
            QVar27 = QVar25;
            if (QVar25.wd.m_i.m_i < QVar24.wd.m_i.m_i) {
              QVar27 = QVar24;
            }
            RVar36.m_i = QVar25.ht.m_i.m_i;
            if (QVar25.ht.m_i.m_i < QVar24.ht.m_i.m_i) {
              RVar36.m_i = QVar24.ht.m_i.m_i;
            }
            uVar26 = (**(code **)(*(long *)this_02 + 0x78))(this_02);
            RVar32.m_i = QVar27.wd.m_i.m_i;
            if (QVar27.wd.m_i.m_i <= (int)(uint)uVar26) {
              RVar32.m_i = (uint)uVar26;
            }
            uVar30 = (uint)((ulong)uVar26 >> 0x20);
            if (RVar36.m_i <= (int)uVar30) {
              RVar36.m_i = uVar30;
            }
            QVar27 = QWidget::maximumSize(this_02);
            local_130 = (ulong)(uint)RVar32.m_i;
            if (QVar27.wd.m_i.m_i <= RVar32.m_i) {
              local_130 = (ulong)QVar27 & 0xffffffff;
            }
            uVar37 = (ulong)(uint)RVar36.m_i;
            if (QVar27.ht.m_i.m_i <= RVar36.m_i) {
              uVar37 = (ulong)QVar27 >> 0x20;
            }
            local_130 = local_130 | uVar37 << 0x20;
          }
          iVar20 = (int)local_130;
          iVar21 = (int)(local_130 >> 0x20);
          if (0 < iVar21 && 0 < iVar20) {
            if (local_1dc <= iVar20) {
              local_1dc = iVar20;
            }
            iVar14 = iVar14 + iVar21;
            if ((this->scroll == (QMenuScroller *)0x0) && (iVar17 < iVar14)) {
              this->ncols = this->ncols + '\x01';
              iVar14 = iVar33;
            }
            pQVar28 = QList<QRect>::data(this_00);
            *(undefined8 *)((long)pQVar28 + local_1d0 + -0xc) = 0;
            *(int *)((long)pQVar28 + local_1d0 + -4) = iVar20 + -1;
            *(int *)((long)&(pQVar28->x1).m_i + local_1d0) = iVar21 + -1;
          }
          QStyleOptionMenuItem::~QStyleOptionMenuItem((QStyleOptionMenuItem *)&action);
          bVar10 = bVar9;
        }
        else {
          bVar10 = 1;
        }
      }
      local_1d0 = local_1d0 + 0x10;
    }
    local_1dc = local_1dc + this->tabWidth;
    if (((this->field_0x421 & 4) == 0) || (this->scroll != (QMenuScroller *)0x0)) {
      action = (QAction *)0x0;
      iVar12 = (**(code **)(*(long *)pQVar22 + 0xe8))(pQVar22,10,&opt,&action,pQVar29);
      QVar27 = QWidget::minimumSize(pQVar29);
      iVar14 = (int)(this->super_QWidgetPrivate).leftmargin;
      iVar12 = QVar27.wd.m_i.m_i -
               (iVar12 + iVar14 + (iVar16 + iVar13) * 2 +
               (int)(this->super_QWidgetPrivate).rightmargin);
      if (iVar12 <= local_1dc) {
        iVar12 = local_1dc;
      }
    }
    else {
      iVar14 = (int)(this->super_QWidgetPrivate).leftmargin;
      iVar12 = local_1dc;
    }
    iVar14 = iVar14 + iVar16 + iVar13;
    iVar15 = iVar33;
    for (uVar37 = 0; uVar37 < (ulong)(this->super_QWidgetPrivate).actions.d.size;
        uVar37 = uVar37 + 1) {
      pQVar28 = QList<QRect>::data(this_00);
      this_03 = pQVar28 + uVar37;
      bVar7 = QRect::isNull(this_03);
      if (!bVar7) {
        if (this->scroll == (QMenuScroller *)0x0) {
          iVar16 = iVar33;
          iVar18 = iVar13 + iVar12;
          if ((((this_03->y2).m_i + iVar15) - (this_03->y1).m_i) + 1 <= iVar17) {
            iVar18 = 0;
            iVar16 = iVar15;
          }
          iVar15 = iVar16;
          iVar14 = iVar14 + iVar18;
        }
        QRect::translate(this_03,iVar14,iVar15);
        (this_03->x2).m_i = (this_03->x1).m_i + iVar12 + -1;
        pQVar29 = QHash<QAction_*,_QWidget_*>::value
                            (this_01,(this->super_QWidgetPrivate).actions.d.ptr + uVar37);
        if (pQVar29 != (QWidget *)0x0) {
          QWidget::setGeometry(pQVar29,this_03);
          uVar11 = QAction::isVisible();
          (**(code **)(*(long *)pQVar29 + 0x68))(pQVar29,uVar11);
        }
        iVar15 = ((iVar15 + (this_03->y2).m_i) - (this_03->y1).m_i) + 1;
      }
    }
    this->field_0x420 = this->field_0x420 & 0xfe;
    QFontMetrics::~QFontMetrics(&qfm);
    QStyleOption::~QStyleOption(&opt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::updateActionRects(const QRect &screen) const
{
    Q_Q(const QMenu);
    if (!itemsDirty)
        return;

    q->ensurePolished();

    //let's reinitialize the buffer
    actionRects.resize(actions.size());
    actionRects.fill(QRect());

    int lastVisibleAction = getLastVisibleAction();

    QStyle *style = q->style();
    QStyleOption opt;
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q),
              vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q),
              icone = style->pixelMetric(QStyle::PM_SmallIconSize, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);
    const int deskFw = style->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, &opt, q);
    const int tearoffHeight = tearoff ? style->pixelMetric(QStyle::PM_MenuTearoffHeight, &opt, q) : 0;
    const int base_y = vmargin + fw + topmargin + (scroll ? scroll->scrollOffset : 0) + tearoffHeight;
    const int column_max_y = screen.height() - 2 * deskFw - (vmargin + bottommargin + fw);
    int max_column_width = 0;
    int y = base_y;

    //for compatibility now - will have to refactor this away
    tabWidth = 0;
    maxIconWidth = 0;
    hasCheckableItems = false;
    ncols = 1;

    for (int i = 0; i < actions.size(); ++i) {
        QAction *action = actions.at(i);
        if (action->isSeparator() || !action->isVisible() || widgetItems.contains(action))
            continue;
        //..and some members
        hasCheckableItems |= action->isCheckable();
        QIcon is = action->icon();
        if (!is.isNull()) {
            maxIconWidth = qMax<uint>(maxIconWidth, icone + 4);
        }
    }

    //calculate size
    QFontMetrics qfm = q->fontMetrics();
    bool previousWasSeparator = true; // this is true to allow removing the leading separators
#if QT_CONFIG(shortcut)
    const bool contextMenu = isContextMenu();
#endif
    const bool menuSupportsSections = q->style()->styleHint(QStyle::SH_Menu_SupportsSections, nullptr, q);
    for(int i = 0; i <= lastVisibleAction; i++) {
        QAction *action = actions.at(i);
        const bool isSection = action->isSeparator() && (!action->text().isEmpty() || !action->icon().isNull());
        const bool isPlainSeparator = (isSection && !menuSupportsSections)
                                   || (action->isSeparator() && !isSection);

        if (!action->isVisible() ||
            (collapsibleSeparators && previousWasSeparator && isPlainSeparator))
            continue; // we continue, this action will get an empty QRect

        previousWasSeparator = isPlainSeparator;

        //let the style modify the above size..
        QStyleOptionMenuItem opt;
        q->initStyleOption(&opt, action);
        const QFontMetrics &fm = opt.fontMetrics;

        QSize sz;
        if (QWidget *w = widgetItems.value(action)) {
          sz = w->sizeHint().expandedTo(w->minimumSize()).expandedTo(w->minimumSizeHint()).boundedTo(w->maximumSize());
        } else {
            //calc what I think the size is..
            if (action->isSeparator() && action->text().isEmpty()) {
                sz = QSize(2, 2);
            } else {
                QString s = action->text();
                qsizetype t = s.indexOf(u'\t');
                if (t != -1) {
                    tabWidth = qMax(int(tabWidth), qfm.horizontalAdvance(s.mid(t+1)));
                    s = s.left(t);
#if QT_CONFIG(shortcut)
                } else if (action->isShortcutVisibleInContextMenu() || !contextMenu) {
                    QKeySequence seq = action->shortcut();
                    if (!seq.isEmpty())
                        tabWidth = qMax(int(tabWidth), qfm.horizontalAdvance(seq.toString(QKeySequence::NativeText)));
#endif
                }
                sz.setWidth(fm.boundingRect(QRect(), Qt::TextSingleLine | Qt::TextShowMnemonic, s).width());
                sz.setHeight(qMax(fm.height(), qfm.height()));

                QIcon is = action->icon();
                if (!is.isNull()) {
                    QSize is_sz = QSize(icone, icone);
                    if (is_sz.height() > sz.height())
                        sz.setHeight(is_sz.height());
                }
            }
            sz = style->sizeFromContents(QStyle::CT_MenuItem, &opt, sz, q);
        }


        if (!sz.isEmpty()) {
            max_column_width = qMax(max_column_width, sz.width());
            //wrapping
            if (!scroll && y + sz.height() > column_max_y) {
                ncols++;
                y = base_y;
            } else {
                y += sz.height();
            }
            //update the item
            actionRects[i] = QRect(0, 0, sz.width(), sz.height());
        }
    }

    max_column_width += tabWidth; //finally add in the tab width
    if (!tornoff || scroll) { // exclude non-scrollable tear-off menu since the tear-off menu has a fixed size
        const int sfcMargin = style->sizeFromContents(QStyle::CT_Menu, &opt, QSize(0, 0), q).width();
        const int min_column_width = q->minimumWidth() - (sfcMargin + leftmargin + rightmargin + 2 * (fw + hmargin));
        max_column_width = qMax(min_column_width, max_column_width);
    }

    //calculate position
    int x = hmargin + fw + leftmargin;
    y = base_y;

    for(int i = 0; i < actions.size(); i++) {
        QRect &rect = actionRects[i];
        if (rect.isNull())
            continue;
        if (!scroll && y + rect.height() > column_max_y) {
            x += max_column_width + hmargin;
            y = base_y;
        }
        rect.translate(x, y);                        //move
        rect.setWidth(max_column_width); //uniform width

        //we need to update the widgets geometry
        if (QWidget *widget = widgetItems.value(actions.at(i))) {
            widget->setGeometry(rect);
            widget->setVisible(actions.at(i)->isVisible());
        }

        y += rect.height();
    }
    itemsDirty = 0;
}